

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

IOConversionPtr
create_conversion(FFSTypeHandle_conflict src_ioformat,FMFieldList target_field_list,
                 int target_struct_size,int pointer_size,int byte_reversal,
                 FMfloat_format target_fp_format,IOconversion_type initial_conversion,
                 int target_column_major,int string_offset_size,int converted_strings,
                 FMStructDescList target_list)

{
  FMfloat_format FVar1;
  undefined4 uVar2;
  FMFieldList p_Var3;
  FMVarInfoList p_Var4;
  char *__s;
  undefined4 uVar7;
  FFSTypeHandle_conflict p_Var5;
  FFSTypeHandle p_Var6;
  FMField iofield;
  int byte_reversal_00;
  int iVar8;
  FMdata_type FVar9;
  FMdata_type FVar10;
  int iVar11;
  FMFieldList __base;
  IOConversionPtr p_Var12;
  char *pcVar13;
  long lVar14;
  FMFieldList p_Var15;
  size_t sVar16;
  char *__s_00;
  void *pvVar17;
  IOConversionPtr p_Var18;
  conv_routine p_Var19;
  int in_ECX;
  int in_EDX;
  FFSTypeHandle_conflict in_RSI;
  FFSTypeHandle in_RDI;
  int in_R8D;
  FMfloat_format in_R9D;
  bool bVar20;
  bool bVar21;
  double dVar22;
  IOconversion_type unaff_retaddr;
  IOconversion_type in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  char *in_stack_00000028;
  int target_struct_size_1;
  IOConversionPtr subconv;
  char *base_type;
  int format_index;
  FFSTypeHandle_conflict format_1;
  double expansion;
  int local_size;
  FFSTypeHandle_conflict format;
  char *sec_bracket;
  char *first_bracket;
  int multi_dimen_array;
  char *search_name;
  char *tmp_field_name;
  void *default_val;
  long target_elements;
  long in_elements;
  FMdata_type target_data_type;
  FMdata_type in_data_type;
  FMField input_field;
  int i_1;
  int column_row_swap_necessary;
  IOConversionPtr conv_ptr;
  FMfloat_format src_float_format;
  int i;
  int conv_index;
  int input_index;
  IOconversion_type conv;
  FMVarInfoList input_var_list;
  FMFieldList input_field_list;
  FMFieldList nfl_sort;
  int target_field_count;
  long *in_stack_000002c0;
  char *in_stack_000002c8;
  IOConversionPtr in_stack_fffffffffffffe90;
  FMFormat_conflict in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  FMField *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  ulong in_stack_fffffffffffffec0;
  int local_104;
  void *local_c0;
  long local_b0;
  long local_a8;
  int local_88;
  int iStack_84;
  int local_80;
  int local_68;
  int local_64;
  IOconversion_type local_5c;
  FMfloat_format in_stack_ffffffffffffffc0;
  
  byte_reversal_00 = count_FMfield((FMFieldList)in_RSI);
  __base = copy_field_list((FMFieldList)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  p_Var3 = in_RDI->body->field_list;
  p_Var4 = in_RDI->body->var_list;
  local_5c = in_stack_00000008;
  local_64 = 0;
  FVar1 = in_RDI->body->float_format;
  p_Var12 = (IOConversionPtr)ffs_malloc((size_t)in_stack_fffffffffffffe90);
  bVar20 = in_stack_00000010 != in_RDI->body->column_major_arrays;
  if (in_R9D == Format_Unknown) {
    in_R9D = ffs_my_float_format;
  }
  p_Var12->notify_of_format_change = 0;
  p_Var12->context = in_RDI->context;
  p_Var12->ioformat = in_RDI;
  p_Var12->base_size_delta = (long)(in_EDX - in_RDI->body->record_length);
  p_Var12->max_var_expansion = 1.0;
  p_Var12->conv_count = 0;
  qsort(__base,(long)byte_reversal_00,0x18,field_offset_compar);
  p_Var12->native_field_list = __base;
  p_Var12->target_pointer_size = in_ECX;
  p_Var12->required_alignment = 8;
  p_Var12->free_data = (void *)0x0;
  p_Var12->free_func = (_func_void_void_ptr *)0x0;
  p_Var12->conv_func = (conv_routine)0x0;
  p_Var12->conv_func4 = (conv_routine)0x0;
  p_Var12->conv_func2 = (conv_routine)0x0;
  p_Var12->conv_func1 = (conv_routine)0x0;
  p_Var12->conv_pkg = (char *)0x0;
  p_Var12->string_offset_size = (long)in_stack_00000018;
  p_Var12->converted_strings = in_stack_00000020;
  if ((in_EDX < in_RDI->body->record_length) && (in_stack_00000008 < buffer_and_convert)) {
    local_5c = buffer_and_convert;
  }
LAB_001130a2:
  if (0 < local_64) {
    for (local_80 = 0; local_80 < local_64; local_80 = local_80 + 1) {
      p_Var12->conversions[local_80].iovar = (FMVarInfoStruct *)0x0;
      if (p_Var12->conversions[local_80].default_value != (void *)0x0) {
        free(p_Var12->conversions[local_80].default_value);
      }
      if (p_Var12->conversions[local_80].subconversion != (IOConversionPtr)0x0) {
        FFSfree_conversion(in_stack_fffffffffffffe90);
      }
    }
  }
  p_Var12->conversion_type = local_5c;
  local_64 = 0;
  local_68 = 0;
  do {
    if (byte_reversal_00 <= local_68) {
      p_Var19 = generate_conversion((IOConversionPtr)CONCAT44(in_R8D,in_R9D),byte_reversal_00,
                                    in_stack_ffffffffffffffc0);
      p_Var12->conv_func = p_Var19;
      switch(p_Var12->required_alignment) {
      case 0:
      case 8:
      case 0x10:
      case 0x20:
      case 0x40:
        return p_Var12;
      case 1:
        p_Var12->conv_func1 = p_Var12->conv_func;
      case 2:
        p_Var12->conv_func2 = p_Var12->conv_func;
      case 4:
        p_Var12->conv_func4 = p_Var12->conv_func;
        return p_Var12;
      default:
        fprintf(_stderr,"Funky alignment, %d, for conversion %s\n",
                (ulong)(uint)p_Var12->required_alignment,p_Var12->ioformat->body->format_name);
        return p_Var12;
      }
    }
    local_c0 = (void *)0x0;
    bVar21 = false;
    pcVar13 = strchr(__base[local_68].field_name,0x28);
    if ((pcVar13 != (char *)0x0) && (p_Var12->context->fmc->ignore_default_values == 0)) {
      strlen(__base[local_68].field_name);
      local_c0 = ffs_malloc((size_t)in_stack_fffffffffffffe90);
      field_name_strip_get_default
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (void **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    lVar14 = find_field_for_conv(in_stack_fffffffffffffea8,
                                 (FMFieldList)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                                 in_stack_fffffffffffffe90);
    iVar8 = (int)lVar14;
    if (iVar8 == -1) {
      fprintf(_stderr,"Requested field %s missing from input format\n",__base[local_68].field_name);
      FFSfree_conversion(in_stack_fffffffffffffe90);
      if (local_c0 != (void *)0x0) {
        free(local_c0);
      }
      return (IOConversionPtr)0x0;
    }
    if (local_c0 != (void *)0x0) {
      free(local_c0);
    }
    if (iVar8 == -1) {
      in_stack_fffffffffffffe90 = (IOConversionPtr)__base[local_68].field_type;
      in_stack_fffffffffffffe98 = *(FMFormat_conflict *)&__base[local_68].field_size;
      iofield.field_type._0_4_ = in_stack_fffffffffffffeb8;
      iofield.field_name = (char *)in_stack_fffffffffffffeb0;
      iofield.field_type._4_4_ = in_stack_fffffffffffffebc;
      iofield.field_size = (int)in_stack_fffffffffffffec0;
      iofield.field_offset = (int)(in_stack_fffffffffffffec0 >> 0x20);
      create_default_conversion
                (iofield,(void *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (IOConversionPtr *)in_stack_fffffffffffffe98,
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      p_Var12->conversion_type = local_5c;
      local_64 = local_64 + 1;
      p_Var12->conv_count = local_64;
      goto LAB_00114085;
    }
    p_Var15 = p_Var3 + iVar8;
    pcVar13 = p_Var15->field_name;
    __s = p_Var15->field_type;
    uVar2 = p_Var15->field_size;
    uVar7 = p_Var15->field_offset;
    FVar9 = FMarray_str_to_data_type(in_stack_000002c8,in_stack_000002c0);
    if (local_a8 != 1) {
      sVar16 = strlen(__s);
      __s_00 = (char *)memchr(__s,0x5b,sVar16);
      if (__s_00 != (char *)0x0) {
        sVar16 = strlen(__s_00);
        pvVar17 = memchr(__s_00 + 1,0x5b,sVar16);
        bVar21 = pvVar17 != (void *)0x0;
      }
    }
    if (local_a8 == -1) {
      local_a8 = 1;
    }
    FVar10 = FMarray_str_to_data_type(in_stack_000002c8,in_stack_000002c0);
    if (local_b0 == -1) {
      local_b0 = 1;
    }
    if (local_5c < buffer_and_convert) {
      if (__base[local_68].field_offset != p_Var3[iVar8].field_offset) {
        local_5c = buffer_and_convert;
        goto LAB_001130a2;
      }
      if ((((((local_a8 != local_b0) || (FVar9 != FVar10)) || (FVar9 == unknown_type)) ||
           (in_R8D != 0)) ||
          (((FVar9 == float_type && (in_R9D != FVar1)) ||
           ((iVar11 = field_is_flat(in_stack_fffffffffffffe98,
                                    (FMTypeDesc *)in_stack_fffffffffffffe90), iVar11 == 0 ||
            ((bVar20 && (bVar21)))))))) || (__base[local_68].field_size != uVar2)) {
        if ((local_a8 != 1) && (__base[local_68].field_size != uVar2)) {
          local_5c = buffer_and_convert;
          goto LAB_001130a2;
        }
        if ((bVar20) && (bVar21)) {
          local_5c = copy_dynamic_portion;
          goto LAB_001130a2;
        }
        if ((((FVar9 == unknown_type) && (p_Var4[iVar8].var_array == 0)) &&
            (p_Var4[iVar8].type_desc.type != FMType_pointer)) &&
           ((p_Var5 = in_RDI->field_subformats[iVar8], p_Var5 != (FFSTypeHandle_conflict)0x0 &&
            (p_Var5->conversion != (IOConversionPtr_conflict)0x0)))) {
          in_stack_fffffffffffffec0 = (ulong)p_Var5->conversion->conversion_type;
          switch(in_stack_fffffffffffffec0) {
          case 0:
            goto LAB_00114085;
          case 1:
            local_5c = direct_to_mem;
            break;
          case 2:
            goto switchD_00113884_caseD_2;
          case 3:
          }
        }
switchD_00113884_default:
        if (((p_Var4[iVar8].var_array == 0) && (p_Var4[iVar8].type_desc.type != FMType_pointer)) ||
           (__base[local_68].field_size == uVar2)) goto LAB_00113921;
        local_5c = copy_dynamic_portion;
        goto LAB_001130a2;
      }
    }
    else {
      if (local_5c == buffer_and_convert) goto switchD_00113884_default;
      if (local_5c == copy_dynamic_portion) {
LAB_00113921:
        if ((p_Var4[iVar8].var_array != 0) || (p_Var4[iVar8].type_desc.type == FMType_pointer)) {
          in_stack_fffffffffffffebc = __base[local_68].field_size;
          iVar11 = min_align_size(__base[local_68].field_size);
          dVar22 = (double)(in_stack_fffffffffffffebc + iVar11) / (double)(int)uVar2;
          if (p_Var12->max_var_expansion <= dVar22 && dVar22 != p_Var12->max_var_expansion) {
            p_Var12->max_var_expansion = dVar22;
          }
        }
      }
      if ((local_a8 != local_b0) || (FVar9 != FVar10)) {
        fprintf(_stderr,"Requested field %s base type %s \n   differs from source type %s\n\n",
                __base[local_68].field_name,__base[local_68].field_type,__s);
        FFSfree_conversion(in_stack_fffffffffffffe90);
        return (IOConversionPtr)0x0;
      }
      if (local_5c == none_required) {
        local_5c = direct_to_mem;
      }
      p_Var12->conversion_type = local_5c;
      memset(p_Var12->conversions + local_64,0,0x18);
      p_Var12->conversions[local_64].src_field.byte_swap = (uchar)in_R8D;
      p_Var12->conversions[local_64].src_field.src_float_format = (uchar)FVar1;
      p_Var12->conversions[local_64].src_field.target_float_format = (uchar)in_R9D;
      p_Var12->conversions[local_64].subconversion = (IOConversionPtr)0x0;
      p_Var12->conversions[local_64].iovar = (FMVarInfoStruct *)0x0;
      p_Var12->conversions[local_64].rc_swap = no_row_column_swap;
      if ((bool)(bVar20 & bVar21)) {
        if (in_RDI->body->column_major_arrays == 0) {
          p_Var12->conversions[local_64].rc_swap = swap_source_row_major;
        }
        else {
          p_Var12->conversions[local_64].rc_swap = swap_source_column_major;
        }
      }
      FVar9 = FMarray_str_to_data_type(in_stack_000002c8,in_stack_000002c0);
      p_Var12->conversions[local_64].iovar = p_Var4 + iVar8;
      if (FVar9 == unknown_type) {
        p_Var6 = in_RDI->field_subformats[iVar8];
        if (p_Var6 == (FFSTypeHandle)0x0) {
          fprintf(_stderr,"Unknown field type for field %s ->\"%s\", format %p\n",pcVar13,
                  in_RDI->body->field_list[iVar8].field_type,in_RDI);
          FFSfree_conversion(in_stack_fffffffffffffe90);
          return (IOConversionPtr)0x0;
        }
        local_104 = 0;
        pcVar13 = base_data_type((char *)in_stack_fffffffffffffe90);
        while( true ) {
          in_stack_fffffffffffffeb8 = in_stack_fffffffffffffeb8 & 0xffffff;
          if (*(long *)(in_stack_00000028 + (long)local_104 * 0x20) != 0) {
            iVar11 = strcmp(pcVar13,*(char **)(in_stack_00000028 + (long)local_104 * 0x20));
            in_stack_fffffffffffffeb8 = CONCAT13(iVar11 != 0,(int3)in_stack_fffffffffffffeb8);
          }
          if ((char)(in_stack_fffffffffffffeb8 >> 0x18) == '\0') break;
          local_104 = local_104 + 1;
        }
        free(pcVar13);
        if (p_Var6 == in_RDI) {
          p_Var12->conversions[local_64].subconversion = p_Var12;
        }
        else if (*(long *)(in_stack_00000028 + (long)local_104 * 0x20) != 0) {
          in_stack_fffffffffffffe90 =
               (IOConversionPtr)
               CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),in_stack_00000010);
          in_stack_fffffffffffffe98 =
               (FMFormat_conflict)
               CONCAT44((int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_00000018);
          in_stack_fffffffffffffea0 = in_stack_00000020;
          in_stack_fffffffffffffea8 = in_stack_00000028;
          p_Var18 = create_conversion(in_RSI,(FMFieldList)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,
                                      byte_reversal_00,in_stack_ffffffffffffffc0,unaff_retaddr,
                                      in_stack_00000008,in_stack_00000010,in_stack_00000018,
                                      (FMStructDescList)
                                      CONCAT44(in_stack_00000024,in_stack_00000020));
          if (p_Var12->conversions[local_64].subconversion != (IOConversionPtr)0x0) {
            printf("Subconversion already had value!\n");
          }
          p_Var12->conversions[local_64].subconversion = p_Var18;
        }
      }
      if (p_Var4[iVar8].var_array != 0) {
        local_a8 = 1;
      }
      p_Var12->conversions[local_64].src_field.data_type = FVar9;
      p_Var12->conversions[local_64].src_field.offset = (long)(int)uVar7;
      p_Var12->conversions[local_64].src_field.size = uVar2;
      p_Var12->conversions[local_64].dest_size = __base[local_68].field_size;
      p_Var12->conversions[local_64].dest_offset = (long)__base[local_68].field_offset;
      p_Var12->conversions[local_64].default_value = (void *)0x0;
      local_64 = local_64 + 1;
      p_Var12->conv_count = local_64;
    }
LAB_00114085:
    local_68 = local_68 + 1;
  } while( true );
switchD_00113884_caseD_2:
  local_5c = buffer_and_convert;
  goto LAB_001130a2;
}

Assistant:

static
IOConversionPtr
create_conversion(FFSTypeHandle src_ioformat, FMFieldList target_field_list, int target_struct_size, int pointer_size,
		  int byte_reversal, FMfloat_format target_fp_format, IOconversion_type initial_conversion,
		  int target_column_major, int string_offset_size, int converted_strings, FMStructDescList target_list)
{
    int target_field_count = count_FMfield(target_field_list);
    FMFieldList nfl_sort = copy_field_list(target_field_list);
    FMFieldList input_field_list = src_ioformat->body->field_list;
    FMVarInfoList input_var_list = src_ioformat->body->var_list;
    IOconversion_type conv = initial_conversion;
    int input_index, conv_index = 0, i = 0;
    FMfloat_format src_float_format = src_ioformat->body->float_format;
    IOConversionPtr conv_ptr =
	(IOConversionPtr) malloc(sizeof(IOConversionStruct) +
				 target_field_count * sizeof(IOconvFieldStruct));
    int column_row_swap_necessary = (target_column_major != src_ioformat->body->column_major_arrays);
    
    if (target_fp_format == Format_Unknown) target_fp_format = ffs_my_float_format;

    conv_ptr->notify_of_format_change = 0;
    conv_ptr->context = src_ioformat->context;
    conv_ptr->ioformat = src_ioformat;
    conv_ptr->base_size_delta = target_struct_size -
	src_ioformat->body->record_length;
    conv_ptr->max_var_expansion = 1.0;
    conv_ptr->conv_count = 0;
    qsort(nfl_sort, target_field_count, sizeof(nfl_sort[0]),
	  field_offset_compar);
    conv_ptr->native_field_list = nfl_sort;
    conv_ptr->target_pointer_size = pointer_size;
    conv_ptr->required_alignment = 8; /* placeholder */
    conv_ptr->free_data = NULL;
    conv_ptr->free_func = NULL;
    conv_ptr->conv_func = NULL;
    conv_ptr->conv_func4 = NULL;
    conv_ptr->conv_func2 = NULL;
    conv_ptr->conv_func1 = NULL;
    conv_ptr->conv_pkg = NULL;
    conv_ptr->string_offset_size = string_offset_size;
    conv_ptr->converted_strings = converted_strings;

    /* 
     * We assume that the fields listed in the target_field_list are
     * those that the user is interested in.  Skipping input fields
     * is OK... 
     */

    if (src_ioformat->body->record_length > target_struct_size) {
	/* if input record is larger than target record, must do buffered */
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    conv = buffer_and_convert;
	    break;
	case buffer_and_convert:
	case copy_dynamic_portion:
	    break;
	default:
	    assert(FALSE);
	}
    }
    /* try for no conversion/direct_to_memory first.. */
  restart:
    if (conv_index > 0) {
	/* really a restart, NULL a couple of things */
	int i = 0;
	for (i=0; i < conv_index; i++) {
	    conv_ptr->conversions[i].iovar = NULL;
	    if (conv_ptr->conversions[i].default_value) {
		free(conv_ptr->conversions[i].default_value);
	    }
	    if (conv_ptr->conversions[i].subconversion) {
		FFSfree_conversion(conv_ptr->conversions[i].subconversion);
	    }
	}
    }
    conv_ptr->conversion_type = conv;
    input_index = conv_index = 0;
    for (i = 0; i < target_field_count; i++) {
	FMField input_field;
	FMdata_type in_data_type, target_data_type;
	long in_elements, target_elements;
	void *default_val = NULL;
	char *tmp_field_name = NULL;
	char *search_name;
	int multi_dimen_array = 0;

	/* 
	 * all fields in the target list must appear at the same offset
	 * as in the input list.
	 */
	input_index = 0;
	
	if ((strchr(nfl_sort[i].field_name, '(') == NULL) || conv_ptr->context->fmc->ignore_default_values) {
	    /* no default value */
	    search_name = (char *) nfl_sort[i].field_name;
	} else {
	    tmp_field_name = malloc(strlen(nfl_sort[i].field_name)); /* certainly big enough */
	    field_name_strip_get_default(&nfl_sort[i], tmp_field_name, &default_val);
	    search_name = tmp_field_name;
	}
	input_index = find_field_for_conv(search_name, input_field_list, i, NULL);
	if (input_index == -1) {
	    if(default_val){
	        if ((conv == buffer_and_convert) || 
		    (conv == copy_dynamic_portion)) {
		    input_index = -1; /* Basically invalidating input_index
				   Indication for using default_val */
		    break;
		} else {
		    if (default_val) {
		        free(default_val);
			default_val = NULL;
		    }
		    conv = buffer_and_convert;
		    if (tmp_field_name) free(tmp_field_name);
		    goto restart;
		}
	    }
	    fprintf(stderr,
		    "Requested field %s missing from input format\n",
		    nfl_sort[i].field_name);
	    FFSfree_conversion(conv_ptr);
	    if (tmp_field_name) free(tmp_field_name);
	    return NULL;
	}
	if (tmp_field_name) free(tmp_field_name);
	if(input_index == -1){
	    create_default_conversion(nfl_sort[i], default_val, &conv_ptr, 
				      conv_index);
	    conv_ptr->conversion_type = conv;
	    conv_ptr->conv_count = ++conv_index;
	    continue;
	} else {
	    if (default_val) {
		free(default_val);
		default_val = NULL;
	    }
	}
	input_field = input_field_list[input_index];
	in_data_type = FMarray_str_to_data_type(input_field.field_type,
					      &in_elements);
	if (in_elements != 1) {
	    char *first_bracket = memchr(input_field.field_type, '[', strlen(input_field.field_type));
	    if (first_bracket != NULL) {
		char *sec_bracket = memchr(first_bracket+1, '[', strlen(first_bracket));
		if (sec_bracket) multi_dimen_array++;
	    }
	}
	    
	if (in_elements == -1) {
	    in_elements = 1;	/* var array */
	}
	target_data_type = FMarray_str_to_data_type(nfl_sort[i].field_type,
						  &target_elements);
	if (target_elements == -1) {
	    target_elements = 1;	/* var array */
	}
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    if (nfl_sort[i].field_offset !=
		input_field_list[input_index].field_offset) {

		/* 
		 * we were planning direct to memory transfer, but found a 
		 * field that we couldn't do that way.   start over
		 * planning buffer and convert. 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if ((in_elements == target_elements) &&
		(in_data_type == target_data_type) &&
		(in_data_type != unknown_type) &&
		(!byte_reversal) &&
		((in_data_type != float_type) ||
		 (target_fp_format == src_float_format)) &&
		field_is_flat(src_ioformat->body, 
			      &input_var_list[input_index].type_desc) &&
		(!column_row_swap_necessary || !multi_dimen_array) &&
		(nfl_sort[i].field_size == input_field.field_size)) {
		/* nothing to do for this field */
		continue;
	    }
	    if ((in_elements != 1) &&
		(nfl_sort[i].field_size != input_field.field_size)) {
		/* Can't do direct to memory with array field interleaving 
		 * 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if (column_row_swap_necessary && multi_dimen_array) {
		/* Can't transpose an array in place
		 * 
		 */
		conv = copy_dynamic_portion;
		goto restart;
	    }

	    if ((in_data_type == unknown_type) && 
		!input_var_list[input_index].var_array &&
		(input_var_list[input_index].type_desc.type != FMType_pointer)) {
		FFSTypeHandle format = src_ioformat->field_subformats[input_index];
		if ((format != NULL) && (format->conversion != NULL)) {
		    switch (format->conversion->conversion_type) {
		    case copy_dynamic_portion:
			assert(conv == copy_dynamic_portion);
			break;
		    case buffer_and_convert:
			conv = buffer_and_convert;
			goto restart;
		    case direct_to_mem:
			conv = direct_to_mem;
			break;
		    case none_required:
			continue;
		    }
		}
	    }
	    /* falling through */
	case buffer_and_convert:
	    if (input_var_list[input_index].var_array ||
	    	(input_var_list[input_index].type_desc.type == FMType_pointer)) {
	    	if (nfl_sort[i].field_size != input_field.field_size) {
	    	    /* argh.  Must buffer variant part too */
	    	    conv = copy_dynamic_portion;
	    	    goto restart;
	    	}
	    }
	case copy_dynamic_portion:
	    if (input_var_list[input_index].var_array ||
		(input_var_list[input_index].type_desc.type == FMType_pointer)) {
		/* 
		 * expansion value includes padding for possibly having
		 * to re-align the value to the proper boundary.
		 * (This is generally a gross overestimate, but it's safe.)
		 */
		int local_size = nfl_sort[i].field_size +
		min_align_size(nfl_sort[i].field_size);
		double expansion = ((double) local_size) / input_field.field_size;
		if (expansion > conv_ptr->max_var_expansion) {
		    conv_ptr->max_var_expansion = expansion;
		}
	    }
	    break;
	default:
	    assert(FALSE);
	}
	if ((in_elements != target_elements) || 
	    (in_data_type != target_data_type)) {

	    fprintf(stderr,
		    "Requested field %s base type %s \n   differs from source type %s\n\n",
		    nfl_sort[i].field_name, nfl_sort[i].field_type,
		    input_field.field_type);
	    FFSfree_conversion(conv_ptr);
	    return NULL;
	}
	if (conv == none_required) {
	    conv = direct_to_mem;
	}
	conv_ptr->conversion_type = conv;
	memset(&conv_ptr->conversions[conv_index].src_field, 0, 
	       sizeof(conv_ptr->conversions[conv_index].src_field));
	conv_ptr->conversions[conv_index].src_field.byte_swap = byte_reversal;
	conv_ptr->conversions[conv_index].src_field.src_float_format =
	    src_float_format;
	conv_ptr->conversions[conv_index].src_field.target_float_format =
	    target_fp_format;
	conv_ptr->conversions[conv_index].subconversion = NULL;
	conv_ptr->conversions[conv_index].iovar = NULL;
	conv_ptr->conversions[conv_index].rc_swap = no_row_column_swap;
	if (column_row_swap_necessary & multi_dimen_array) {
	    if (src_ioformat->body->column_major_arrays) {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_column_major;
	    } else {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_row_major;
	    }
	}
	in_data_type = FMarray_str_to_data_type(input_field.field_type, 
					      &in_elements);
	conv_ptr->conversions[conv_index].iovar =
	    &input_var_list[input_index];
	if (in_data_type == unknown_type) {
	    FFSTypeHandle format = src_ioformat->field_subformats[input_index];
	    if (format != NULL) {
		int format_index = 0;
		char *base_type = base_data_type(input_field.field_type);

		while(target_list[format_index].format_name && 
		      (strcmp(base_type, target_list[format_index].format_name) != 0)) {
		    format_index++;
		}
		free(base_type);
	        if (format == src_ioformat) {
		    conv_ptr->conversions[conv_index].subconversion = conv_ptr;
		} else if (target_list[format_index].format_name != NULL) {
		    IOConversionPtr subconv;
		    int target_struct_size = target_list[format_index].struct_size;
		    subconv =
		      create_conversion(format,
					target_list[format_index].field_list,
					target_struct_size, pointer_size,
					byte_reversal, target_fp_format,
					conv, target_column_major,
					string_offset_size,
					converted_strings, target_list);
		    if (conv_ptr->conversions[conv_index].subconversion) {
			printf("Subconversion already had value!\n");
		    }
		    conv_ptr->conversions[conv_index].subconversion = subconv;
		}
	    } else {
		
		fprintf(stderr, "Unknown field type for field %s ->\"%s\", format %p\n",
			input_field.field_name,
			src_ioformat->body->field_list[input_index].field_type,
			src_ioformat);
		FFSfree_conversion(conv_ptr);
		return NULL;
	    }
	}
	if (input_var_list[input_index].var_array) {
	    in_elements = 1;
	}
	conv_ptr->conversions[conv_index].src_field.data_type = in_data_type;
	conv_ptr->conversions[conv_index].src_field.offset =
	    input_field.field_offset;
	conv_ptr->conversions[conv_index].src_field.size =
	    input_field.field_size;
	conv_ptr->conversions[conv_index].dest_size =
	    nfl_sort[i].field_size;
	conv_ptr->conversions[conv_index].dest_offset =
	    nfl_sort[i].field_offset;
	conv_ptr->conversions[conv_index].default_value = NULL;
	conv_ptr->conv_count = ++conv_index;
	if (default_val) {
	    free(default_val);
	    default_val = NULL;
	}
    }
    conv_ptr->conv_func = generate_conversion(conv_ptr, src_ioformat->body->alignment, 4);
    switch(conv_ptr->required_alignment) {
    case 1:
	conv_ptr->conv_func1 = conv_ptr->conv_func;
	/* falling */
    case 2:
	conv_ptr->conv_func2 = conv_ptr->conv_func;
	/* falling */
    case 4:
	conv_ptr->conv_func4 = conv_ptr->conv_func;
	/* falling */
    case 8:
    case 16:
    case 32:
    case 64:
	/* really can't imagine these currently, but... */
    case 0:
	/* zero is no conversion, so no requirement */
	break;
    default:
	fprintf(stderr, "Funky alignment, %d, for conversion %s\n",
		conv_ptr->required_alignment, 
		conv_ptr->ioformat->body->format_name);
    }
    return conv_ptr;
}